

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVM.cpp
# Opt level: O3

bool __thiscall NanoVM::execute(NanoVM *this,Instruction *inst)

{
  uchar uVar1;
  uchar uVar2;
  ulong *puVar3;
  byte bVar4;
  ushort uVar5;
  uint64_t uVar6;
  ulong uVar7;
  uchar *puVar8;
  uint64_t *puVar9;
  uint uVar10;
  uint64_t *puVar11;
  char *__format;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  
  if (inst->isDstMem == true) {
    uVar7 = (ulong)inst->dstReg;
    puVar11 = (uint64_t *)((this->cpu).codeBase + (this->cpu).registers[uVar7]);
  }
  else {
    uVar7 = (ulong)inst->dstReg;
    puVar11 = (this->cpu).registers + uVar7;
  }
  if (inst->srcType == '\0') {
    if (inst->isSrcMem == false) {
      uVar12 = (ulong)inst->srcReg;
      puVar9 = (this->cpu).registers + uVar12;
    }
    else {
      uVar12 = (ulong)inst->srcReg;
      puVar9 = (uint64_t *)((this->cpu).codeBase + (this->cpu).registers[uVar12]);
    }
    bVar4 = 0;
  }
  else {
    puVar9 = (uint64_t *)((this->cpu).codeBase + inst->immediate);
    if (inst->isSrcMem == false) {
      puVar9 = &inst->immediate;
    }
    bVar4 = inst->isDstMem ^ 1;
    uVar12 = (ulong)inst->srcReg;
  }
  if ((((puVar9 != &inst->immediate) && (puVar9 != (this->cpu).registers + uVar12)) &&
      ((puVar3 = (ulong *)(this->cpu).codeBase, puVar9 < puVar3 ||
       ((ulong *)((long)puVar3 + (this->cpu).stackSize + (this->cpu).codeSize) <= puVar9)))) ||
     ((puVar11 != (this->cpu).registers + uVar7 &&
      ((puVar3 = (ulong *)(this->cpu).codeBase, puVar11 < puVar3 ||
       ((ulong *)((long)puVar3 + (this->cpu).stackSize + (this->cpu).codeSize) < puVar11)))))) {
    this->errorFlag = ' ';
    return false;
  }
  uVar1 = inst->srcSize;
  uVar2 = inst->opcode;
  if (uVar1 != '\x02') {
    if (uVar1 == '\x01') {
      if (bVar4 != 0) {
        bVar13 = false;
        switch(uVar2) {
        case '\0':
          uVar7 = (ulong)(ushort)*puVar9;
          break;
        case '\x01':
          uVar7 = (ulong)(ushort)*puVar9;
          goto LAB_00101fc4;
        case '\x02':
          uVar7 = (ulong)(ushort)*puVar9;
          goto LAB_00101ffa;
        case '\x03':
          uVar10 = (uint)(ushort)*puVar9;
LAB_00102002:
          uVar7 = (ulong)(uVar10 & (uint)*puVar11);
          break;
        case '\x04':
          uVar7 = (ulong)(ushort)*puVar9;
          goto LAB_00102075;
        case '\x05':
          uVar7 = (ulong)(ushort)*puVar9;
          goto LAB_0010204b;
        case '\x06':
          goto switchD_0010190f_caseD_6;
        case '\a':
          goto switchD_0010190f_caseD_7;
        default:
          goto switchD_0010190f_caseD_8;
        case '\n':
          uVar7 = (ulong)(ushort)*puVar9;
          goto LAB_00102052;
        case '\v':
          uVar7 = (ulong)(ushort)*puVar9;
          goto LAB_00102036;
        case '\f':
          uVar7 = (ulong)(ushort)*puVar9;
          goto LAB_00101f60;
        case '\r':
          goto switchD_00101938_caseD_d;
        case '\x0e':
          goto switchD_00101938_caseD_e;
        case '\x0f':
          goto switchD_00101938_caseD_f;
        case '\x10':
          goto switchD_00101938_caseD_10;
        case '\x11':
          goto switchD_00101938_caseD_11;
        case '\x12':
          goto switchD_00101938_caseD_12;
        case '\x14':
          goto switchD_00101938_caseD_14;
        case '\x15':
          goto switchD_00101938_caseD_15;
        case '\x16':
          goto switchD_0010190f_caseD_16;
        case '\x17':
          goto switchD_00101938_caseD_17;
        case '\x18':
          goto switchD_00101938_caseD_18;
        case '\x19':
          goto switchD_00101938_caseD_19;
        case '\x1b':
          goto switchD_00101938_caseD_1b;
        case '\x1c':
          goto switchD_0010190f_caseD_1c;
        case '\x1d':
          goto switchD_00101938_caseD_1d;
        }
        goto LAB_00102056;
      }
      bVar13 = false;
      switch(uVar2) {
      case '\0':
        uVar5 = (ushort)*puVar9;
        goto LAB_001020a1;
      case '\x01':
        *(ushort *)puVar11 = (ushort)*puVar11 + (ushort)*puVar9;
        break;
      case '\x02':
        *(ushort *)puVar11 = (ushort)*puVar11 - (ushort)*puVar9;
        break;
      case '\x03':
        *(ushort *)puVar11 = (ushort)*puVar11 & (ushort)*puVar9;
        break;
      case '\x04':
        *(ushort *)puVar11 = (ushort)*puVar11 | (ushort)*puVar9;
        break;
      case '\x05':
        *(ushort *)puVar11 = (ushort)*puVar11 ^ (ushort)*puVar9;
        break;
      case '\x06':
        uVar5 = (ushort)*puVar11 >> ((byte)*puVar9 & 0x1f);
        goto LAB_0010202f;
      case '\a':
        uVar5 = (ushort)*puVar11 << ((byte)*puVar9 & 0x1f);
        goto LAB_0010202f;
      default:
        goto switchD_0010190f_caseD_8;
      case '\n':
        uVar5 = (ushort)*puVar11 * (ushort)*puVar9;
        goto LAB_001020a1;
      case '\v':
        uVar5 = (ushort)*puVar11 / (ushort)*puVar9;
LAB_001020a1:
        *(ushort *)puVar11 = uVar5;
        break;
      case '\f':
        *(ushort *)puVar11 = (ushort)*puVar11 % (ushort)*puVar9;
        break;
      case '\r':
switchD_00101938_caseD_d:
        bVar13 = (ushort)*puVar11 < (ushort)*puVar9;
        bVar14 = (ushort)*puVar11 == (ushort)*puVar9;
        goto joined_r0x00101aad;
      case '\x0e':
switchD_00101938_caseD_e:
        bVar4 = (byte)(this->cpu).registers[9] & 0x80;
        goto joined_r0x00101a52;
      case '\x0f':
switchD_00101938_caseD_f:
        if (((this->cpu).registers[9] & 0x80) == 0) goto switchD_00101938_caseD_12;
        break;
      case '\x10':
switchD_00101938_caseD_10:
        bVar4 = (byte)(this->cpu).registers[9] & 0x40;
        goto joined_r0x00101a52;
      case '\x11':
switchD_00101938_caseD_11:
        bVar4 = (byte)(this->cpu).registers[9] & 0x20;
joined_r0x00101a52:
        if (bVar4 == 0) break;
switchD_00101938_caseD_12:
        uVar7 = (ulong)(short)(ushort)*puVar9;
        goto LAB_0010205e;
      case '\x12':
        goto switchD_00101938_caseD_12;
      case '\x14':
switchD_00101938_caseD_14:
        *(ushort *)puVar9 = (ushort)*puVar9 + 1;
        break;
      case '\x15':
switchD_00101938_caseD_15:
        *(ushort *)puVar9 = (ushort)*puVar9 - 1;
        break;
      case '\x16':
        goto switchD_0010190f_caseD_16;
      case '\x17':
switchD_00101938_caseD_17:
        uVar6 = (this->cpu).registers[7];
        if ((uchar *)(uVar6 + 8) < (this->cpu).stackBase + (this->cpu).stackSize) {
          *(ulong *)((this->cpu).codeBase + uVar6) =
               (ulong)inst->instructionSize + (this->cpu).registers[8];
          puVar11 = (this->cpu).registers + 7;
          *puVar11 = *puVar11 + 8;
        }
        else {
          this->errorFlag = 0x80;
        }
        goto switchD_00101938_caseD_12;
      case '\x18':
switchD_00101938_caseD_18:
        uVar6 = (this->cpu).registers[7];
        puVar8 = (uchar *)(uVar6 + 2);
        if ((this->cpu).stackBase + (this->cpu).stackSize <= puVar8) goto LAB_00101d00;
        *(ushort *)((this->cpu).codeBase + uVar6) = (ushort)*puVar9;
        goto LAB_00101c19;
      case '\x19':
switchD_00101938_caseD_19:
        uVar6 = (this->cpu).registers[7];
        uVar7 = uVar6 - 2;
        if (uVar7 < (this->cpu).codeSize) {
          this->errorFlag = 0x80;
          uVar5 = 0;
        }
        else {
          uVar5 = *(ushort *)((this->cpu).codeBase + (uVar6 - 2));
          (this->cpu).registers[7] = uVar7;
        }
LAB_0010202f:
        *(ushort *)puVar11 = uVar5;
        break;
      case '\x1b':
switchD_00101938_caseD_1b:
        uVar7 = (ulong)(ushort)*puVar9;
        goto LAB_00101d86;
      case '\x1c':
        goto switchD_0010190f_caseD_1c;
      case '\x1d':
switchD_00101938_caseD_1d:
        uVar10 = (uint)(ushort)*puVar9;
        goto LAB_00101abb;
      }
      goto LAB_00102059;
    }
    if (uVar1 == '\0') {
      if (bVar4 != 0) {
        bVar13 = false;
        switch(uVar2) {
        case '\0':
          uVar7 = (ulong)(byte)*puVar9;
          goto LAB_00102056;
        case '\x01':
          uVar7 = (ulong)(byte)*puVar9;
          goto LAB_00101fc4;
        case '\x02':
          uVar7 = (ulong)(byte)*puVar9;
          goto LAB_00101ffa;
        case '\x03':
          uVar10 = (uint)(byte)*puVar9;
          goto LAB_00102002;
        case '\x04':
          uVar7 = (ulong)(byte)*puVar9;
          goto LAB_00102075;
        case '\x05':
          uVar7 = (ulong)(byte)*puVar9;
          goto LAB_0010204b;
        case '\x06':
          goto switchD_0010190f_caseD_6;
        case '\a':
          goto switchD_0010190f_caseD_7;
        default:
          goto switchD_0010190f_caseD_8;
        case '\n':
          uVar7 = (ulong)(byte)*puVar9;
          goto LAB_00102052;
        case '\v':
          uVar7 = (ulong)(byte)*puVar9;
          goto LAB_00102036;
        case '\f':
          uVar7 = (ulong)(byte)*puVar9;
          goto LAB_00101f60;
        case '\r':
          goto switchD_0010190f_caseD_d;
        case '\x0e':
          goto switchD_0010190f_caseD_e;
        case '\x0f':
          goto switchD_0010190f_caseD_f;
        case '\x10':
          goto switchD_0010190f_caseD_10;
        case '\x11':
          goto switchD_0010190f_caseD_11;
        case '\x12':
          goto switchD_0010190f_caseD_12;
        case '\x14':
          goto switchD_0010190f_caseD_14;
        case '\x15':
          goto switchD_0010190f_caseD_15;
        case '\x16':
          goto switchD_0010190f_caseD_16;
        case '\x17':
          goto switchD_0010190f_caseD_17;
        case '\x18':
          goto switchD_0010190f_caseD_18;
        case '\x19':
          goto switchD_0010190f_caseD_19;
        case '\x1b':
          goto switchD_0010190f_caseD_1b;
        case '\x1c':
          goto switchD_0010190f_caseD_1c;
        case '\x1d':
          goto switchD_0010190f_caseD_1d;
        }
      }
      bVar13 = false;
      switch(uVar2) {
      case '\0':
        bVar4 = (byte)*puVar9;
        goto LAB_001020b5;
      case '\x01':
        *(byte *)puVar11 = (byte)*puVar11 + (byte)*puVar9;
        break;
      case '\x02':
        *(byte *)puVar11 = (byte)*puVar11 - (byte)*puVar9;
        break;
      case '\x03':
        *(byte *)puVar11 = (byte)*puVar11 & (byte)*puVar9;
        break;
      case '\x04':
        *(byte *)puVar11 = (byte)*puVar11 | (byte)*puVar9;
        break;
      case '\x05':
        *(byte *)puVar11 = (byte)*puVar11 ^ (byte)*puVar9;
        break;
      case '\x06':
        bVar4 = (byte)*puVar11 >> ((byte)*puVar9 & 0x1f);
        goto LAB_00102081;
      case '\a':
        bVar4 = (byte)*puVar11 << ((byte)*puVar9 & 0x1f);
        goto LAB_00102081;
      default:
        goto switchD_0010190f_caseD_8;
      case '\n':
        bVar4 = (byte)*puVar11 * (byte)*puVar9;
        goto LAB_001020b5;
      case '\v':
        bVar4 = (byte)*puVar11 / (byte)*puVar9;
LAB_001020b5:
        *(byte *)puVar11 = bVar4;
        break;
      case '\f':
        bVar4 = (byte)*puVar11 % (byte)*puVar9;
        goto LAB_00102081;
      case '\r':
switchD_0010190f_caseD_d:
        bVar13 = (byte)*puVar11 < (byte)*puVar9;
        bVar14 = (byte)*puVar11 == (byte)*puVar9;
        if (bVar14) goto LAB_00101c5b;
        goto LAB_00101c68;
      case '\x0e':
switchD_0010190f_caseD_e:
        bVar4 = (byte)(this->cpu).registers[9] & 0x80;
        goto joined_r0x00101a69;
      case '\x0f':
switchD_0010190f_caseD_f:
        if (((this->cpu).registers[9] & 0x80) == 0) goto switchD_0010190f_caseD_12;
        break;
      case '\x10':
switchD_0010190f_caseD_10:
        bVar4 = (byte)(this->cpu).registers[9] & 0x40;
        goto joined_r0x00101a69;
      case '\x11':
switchD_0010190f_caseD_11:
        bVar4 = (byte)(this->cpu).registers[9] & 0x20;
joined_r0x00101a69:
        if (bVar4 == 0) break;
switchD_0010190f_caseD_12:
        uVar7 = (ulong)(char)(byte)*puVar9;
        goto LAB_0010205e;
      case '\x12':
        goto switchD_0010190f_caseD_12;
      case '\x14':
switchD_0010190f_caseD_14:
        *(byte *)puVar9 = (byte)*puVar9 + 1;
        break;
      case '\x15':
switchD_0010190f_caseD_15:
        *(byte *)puVar9 = (byte)*puVar9 - 1;
        break;
      case '\x16':
        goto switchD_0010190f_caseD_16;
      case '\x17':
switchD_0010190f_caseD_17:
        uVar6 = (this->cpu).registers[7];
        if ((uchar *)(uVar6 + 8) < (this->cpu).stackBase + (this->cpu).stackSize) {
          *(ulong *)((this->cpu).codeBase + uVar6) =
               (ulong)inst->instructionSize + (this->cpu).registers[8];
          puVar11 = (this->cpu).registers + 7;
          *puVar11 = *puVar11 + 8;
        }
        else {
          this->errorFlag = 0x80;
        }
        goto switchD_0010190f_caseD_12;
      case '\x18':
switchD_0010190f_caseD_18:
        uVar6 = (this->cpu).registers[7];
        if ((this->cpu).stackBase + (this->cpu).stackSize <= (uchar *)(uVar6 + 1))
        goto LAB_00101d00;
        (this->cpu).codeBase[uVar6] = (byte)*puVar9;
        puVar11 = (this->cpu).registers + 7;
        *puVar11 = *puVar11 + 1;
        break;
      case '\x19':
switchD_0010190f_caseD_19:
        uVar6 = (this->cpu).registers[7];
        uVar7 = uVar6 - 1;
        if (uVar7 < (this->cpu).codeSize) {
          this->errorFlag = 0x80;
          bVar4 = 0;
        }
        else {
          bVar4 = (this->cpu).codeBase[uVar6 - 1];
          (this->cpu).registers[7] = uVar7;
        }
LAB_00102081:
        *(byte *)puVar11 = bVar4;
        break;
      case '\x1b':
switchD_0010190f_caseD_1b:
        uVar7 = (ulong)(byte)*puVar9;
        goto LAB_00101d86;
      case '\x1c':
        goto switchD_0010190f_caseD_1c;
      case '\x1d':
switchD_0010190f_caseD_1d:
        uVar10 = (uint)(byte)*puVar9;
        goto LAB_00101abb;
      }
      goto LAB_00102059;
    }
    bVar13 = false;
    switch(uVar2) {
    case '\0':
      uVar7 = *puVar9;
      goto LAB_00102056;
    case '\x01':
      uVar7 = *puVar9;
LAB_00101fc4:
      *puVar11 = *puVar11 + uVar7;
      break;
    case '\x02':
      uVar7 = *puVar9;
LAB_00101ffa:
      *puVar11 = *puVar11 - uVar7;
      break;
    case '\x03':
      *puVar11 = *puVar11 & *puVar9;
      break;
    case '\x04':
      uVar7 = *puVar9;
LAB_00102075:
      *puVar11 = *puVar11 | uVar7;
      break;
    case '\x05':
      uVar7 = *puVar9;
LAB_0010204b:
      *puVar11 = *puVar11 ^ uVar7;
      break;
    case '\x06':
switchD_0010190f_caseD_6:
      *puVar11 = *puVar11 >> ((byte)*puVar9 & 0x3f);
      break;
    case '\a':
switchD_0010190f_caseD_7:
      *puVar11 = *puVar11 << ((byte)*puVar9 & 0x3f);
      break;
    default:
      goto switchD_0010190f_caseD_8;
    case '\n':
      uVar7 = *puVar11 * *puVar9;
      goto LAB_00102056;
    case '\v':
      uVar7 = *puVar11 / *puVar9;
      goto LAB_00102056;
    case '\f':
      uVar7 = *puVar11 % *puVar9;
      goto LAB_00101f68;
    case '\r':
      if (*puVar11 != *puVar9) {
        if (*puVar9 < *puVar11) goto LAB_00101c6e;
        goto LAB_00101be8;
      }
      goto LAB_00101c5b;
    case '\x0e':
      bVar4 = (byte)(this->cpu).registers[9] & 0x80;
      goto joined_r0x00101e19;
    case '\x0f':
      if (((this->cpu).registers[9] & 0x80) == 0) goto switchD_00101985_caseD_12;
      break;
    case '\x10':
      bVar4 = (byte)(this->cpu).registers[9] & 0x40;
      goto joined_r0x00101e19;
    case '\x11':
      bVar4 = (byte)(this->cpu).registers[9] & 0x20;
joined_r0x00101e19:
      if (bVar4 == 0) break;
switchD_00101985_caseD_12:
      uVar7 = *puVar9;
      goto LAB_0010205e;
    case '\x12':
      goto switchD_00101985_caseD_12;
    case '\x14':
      *puVar9 = *puVar9 + 1;
      break;
    case '\x15':
      *puVar9 = *puVar9 - 1;
      break;
    case '\x16':
      goto switchD_0010190f_caseD_16;
    case '\x17':
      uVar6 = (this->cpu).registers[7];
      if ((uchar *)(uVar6 + 8) < (this->cpu).stackBase + (this->cpu).stackSize) {
        *(ulong *)((this->cpu).codeBase + uVar6) =
             (ulong)inst->instructionSize + (this->cpu).registers[8];
        puVar11 = (this->cpu).registers + 7;
        *puVar11 = *puVar11 + 8;
      }
      else {
        this->errorFlag = 0x80;
      }
      goto switchD_00101985_caseD_12;
    case '\x18':
      uVar6 = (this->cpu).registers[7];
      if ((this->cpu).stackBase + (this->cpu).stackSize <= (uchar *)(uVar6 + 8)) goto LAB_00101d00;
      *(uint64_t *)((this->cpu).codeBase + uVar6) = *puVar9;
      puVar11 = (this->cpu).registers + 7;
      *puVar11 = *puVar11 + 8;
      break;
    case '\x19':
      uVar6 = (this->cpu).registers[7];
      uVar12 = uVar6 - 8;
      if (uVar12 < (this->cpu).codeSize) {
        this->errorFlag = 0x80;
        uVar7 = 0;
      }
      else {
        uVar7 = *(ulong *)((this->cpu).codeBase + (uVar6 - 8));
        (this->cpu).registers[7] = uVar12;
      }
      goto LAB_00102056;
    case '\x1b':
      puVar9 = (uint64_t *)*puVar9;
      __format = "%lu";
      goto LAB_00101acf;
    case '\x1c':
      goto switchD_0010190f_caseD_1c;
    case '\x1d':
      goto switchD_00101985_caseD_1d;
    }
    goto LAB_00102059;
  }
  if (bVar4 == 0) {
    bVar13 = false;
    switch(uVar2) {
    case '\0':
      uVar10 = (uint)*puVar9;
      goto LAB_001020ac;
    case '\x01':
      *(uint *)puVar11 = (uint)*puVar11 + (uint)*puVar9;
      break;
    case '\x02':
      *(uint *)puVar11 = (uint)*puVar11 - (uint)*puVar9;
      break;
    case '\x03':
      *(uint *)puVar11 = (uint)*puVar11 & (uint)*puVar9;
      break;
    case '\x04':
      *(uint *)puVar11 = (uint)*puVar11 | (uint)*puVar9;
      break;
    case '\x05':
      *(uint *)puVar11 = (uint)*puVar11 ^ (uint)*puVar9;
      break;
    case '\x06':
      *(uint *)puVar11 = (uint)*puVar11 >> ((byte)*puVar9 & 0x1f);
      break;
    case '\a':
      *(uint *)puVar11 = (uint)*puVar11 << ((byte)*puVar9 & 0x1f);
      break;
    default:
      goto switchD_0010190f_caseD_8;
    case '\n':
      uVar10 = (uint)*puVar11 * (uint)*puVar9;
      goto LAB_001020ac;
    case '\v':
      uVar10 = (uint)*puVar11 / (uint)*puVar9;
LAB_001020ac:
      *(uint *)puVar11 = uVar10;
      break;
    case '\f':
      *(uint *)puVar11 = (uint)*puVar11 % (uint)*puVar9;
      break;
    case '\r':
      goto switchD_00101961_caseD_d;
    case '\x0e':
      goto switchD_00101961_caseD_e;
    case '\x0f':
      goto switchD_00101961_caseD_f;
    case '\x10':
      goto switchD_00101961_caseD_10;
    case '\x11':
      goto switchD_00101961_caseD_11;
    case '\x12':
      goto switchD_00101961_caseD_12;
    case '\x14':
      goto switchD_00101961_caseD_14;
    case '\x15':
      goto switchD_00101961_caseD_15;
    case '\x16':
      goto switchD_0010190f_caseD_16;
    case '\x17':
      goto switchD_00101961_caseD_17;
    case '\x18':
      goto switchD_00101961_caseD_18;
    case '\x19':
      goto switchD_00101961_caseD_19;
    case '\x1b':
      goto switchD_00101961_caseD_1b;
    case '\x1c':
      goto switchD_0010190f_caseD_1c;
    case '\x1d':
      goto switchD_00101985_caseD_1d;
    }
    goto LAB_00102059;
  }
  bVar13 = false;
  switch(uVar2) {
  case '\0':
    uVar7 = (ulong)(uint)*puVar9;
    goto LAB_00102056;
  case '\x01':
    uVar7 = (ulong)(uint)*puVar9;
    goto LAB_00101fc4;
  case '\x02':
    uVar7 = (ulong)(uint)*puVar9;
    goto LAB_00101ffa;
  case '\x03':
    uVar7 = (ulong)((uint)*puVar11 & (uint)*puVar9);
    goto LAB_00102056;
  case '\x04':
    uVar7 = (ulong)(uint)*puVar9;
    goto LAB_00102075;
  case '\x05':
    uVar7 = (ulong)(uint)*puVar9;
    goto LAB_0010204b;
  case '\x06':
    goto switchD_0010190f_caseD_6;
  case '\a':
    goto switchD_0010190f_caseD_7;
  default:
    goto switchD_0010190f_caseD_8;
  case '\n':
    uVar7 = (ulong)(uint)*puVar9;
LAB_00102052:
    uVar7 = uVar7 * *puVar11;
    goto LAB_00102056;
  case '\v':
    uVar7 = (ulong)(uint)*puVar9;
LAB_00102036:
    uVar7 = *puVar11 / uVar7;
LAB_00102056:
    *puVar11 = uVar7;
    break;
  case '\f':
    uVar7 = (ulong)(uint)*puVar9;
LAB_00101f60:
    uVar7 = *puVar11 % uVar7;
LAB_00101f68:
    *puVar11 = uVar7;
    break;
  case '\r':
switchD_00101961_caseD_d:
    bVar13 = (uint)*puVar11 < (uint)*puVar9;
    bVar14 = (uint)*puVar11 == (uint)*puVar9;
joined_r0x00101aad:
    if (bVar14) {
LAB_00101c5b:
      (this->cpu).registers[9] = 0x80;
    }
    else {
LAB_00101c68:
      if (bVar13 || bVar14) {
LAB_00101be8:
        (this->cpu).registers[9] = 0x20;
      }
      else {
LAB_00101c6e:
        (this->cpu).registers[9] = 0x40;
      }
    }
    break;
  case '\x0e':
switchD_00101961_caseD_e:
    bVar4 = (byte)(this->cpu).registers[9] & 0x80;
    goto joined_r0x00101d28;
  case '\x0f':
switchD_00101961_caseD_f:
    if (((this->cpu).registers[9] & 0x80) == 0) goto switchD_00101961_caseD_12;
    break;
  case '\x10':
switchD_00101961_caseD_10:
    bVar4 = (byte)(this->cpu).registers[9] & 0x40;
    goto joined_r0x00101d28;
  case '\x11':
switchD_00101961_caseD_11:
    bVar4 = (byte)(this->cpu).registers[9] & 0x20;
joined_r0x00101d28:
    if (bVar4 == 0) break;
switchD_00101961_caseD_12:
    uVar7 = (ulong)(int)(uint)*puVar9;
    goto LAB_0010205e;
  case '\x12':
    goto switchD_00101961_caseD_12;
  case '\x14':
switchD_00101961_caseD_14:
    *(uint *)puVar9 = (uint)*puVar9 + 1;
    break;
  case '\x15':
switchD_00101961_caseD_15:
    *(uint *)puVar9 = (uint)*puVar9 - 1;
    break;
  case '\x16':
    goto switchD_0010190f_caseD_16;
  case '\x17':
switchD_00101961_caseD_17:
    uVar6 = (this->cpu).registers[7];
    if ((uchar *)(uVar6 + 8) < (this->cpu).stackBase + (this->cpu).stackSize) {
      *(ulong *)((this->cpu).codeBase + uVar6) =
           (ulong)inst->instructionSize + (this->cpu).registers[8];
      puVar11 = (this->cpu).registers + 7;
      *puVar11 = *puVar11 + 8;
    }
    else {
      this->errorFlag = 0x80;
    }
    goto switchD_00101961_caseD_12;
  case '\x18':
switchD_00101961_caseD_18:
    uVar6 = (this->cpu).registers[7];
    puVar8 = (uchar *)(uVar6 + 4);
    if (puVar8 < (this->cpu).stackBase + (this->cpu).stackSize) {
      *(uint *)((this->cpu).codeBase + uVar6) = (uint)*puVar9;
LAB_00101c19:
      (this->cpu).registers[7] = (uint64_t)puVar8;
    }
    else {
LAB_00101d00:
      this->errorFlag = 0x80;
    }
    break;
  case '\x19':
switchD_00101961_caseD_19:
    uVar6 = (this->cpu).registers[7];
    uVar7 = uVar6 - 4;
    if (uVar7 < (this->cpu).codeSize) {
      this->errorFlag = 0x80;
      uVar10 = 0;
    }
    else {
      uVar10 = *(uint *)((this->cpu).codeBase + (uVar6 - 4));
      (this->cpu).registers[7] = uVar7;
    }
    goto LAB_001020ac;
  case '\x1b':
switchD_00101961_caseD_1b:
    uVar7 = (ulong)(uint)*puVar9;
LAB_00101d86:
    printf("%lu",uVar7);
    break;
  case '\x1c':
switchD_0010190f_caseD_1c:
    __format = "%s";
LAB_00101acf:
    printf(__format,puVar9);
    break;
  case '\x1d':
switchD_00101985_caseD_1d:
    uVar10 = (uint)*puVar9;
LAB_00101abb:
    putchar(uVar10);
  }
LAB_00102059:
  uVar7 = (ulong)inst->instructionSize;
LAB_0010205e:
  puVar11 = (this->cpu).registers + 8;
  *puVar11 = *puVar11 + uVar7;
LAB_00102062:
  bVar13 = true;
switchD_0010190f_caseD_8:
  return bVar13;
switchD_0010190f_caseD_16:
  uVar6 = (this->cpu).registers[7];
  uVar7 = uVar6 - 8;
  if (uVar7 < (this->cpu).codeSize) {
    this->errorFlag = 0x80;
    uVar6 = 0;
  }
  else {
    uVar6 = *(uint64_t *)((this->cpu).codeBase + (uVar6 - 8));
    (this->cpu).registers[7] = uVar7;
  }
  (this->cpu).registers[8] = uVar6;
  goto LAB_00102062;
}

Assistant:

bool NanoVM::execute(Instruction &inst) {
	// set source and destination addresses
	void *dst, *src;
	bool isDstReg = false;
	dst = (inst.isDstMem) ? reinterpret_cast<void*>(cpu.codeBase + cpu.registers[inst.dstReg]) : reinterpret_cast<void*>(&cpu.registers[inst.dstReg]);
	if (inst.srcType == DataType::Reg) {
		src = (inst.isSrcMem) ? reinterpret_cast<void*>(cpu.codeBase + cpu.registers[inst.srcReg]) : reinterpret_cast<void*>(&cpu.registers[inst.srcReg]);
	}
	else {
		isDstReg = (inst.isDstMem) ? false : true;
		src = (inst.isSrcMem) ? reinterpret_cast<void*>(cpu.codeBase + inst.immediate) : reinterpret_cast<void*>(&inst.immediate);
	}
	// Do bounds check
	if ((src != &inst.immediate && src != &cpu.registers[inst.srcReg] && (src < cpu.codeBase || src >= cpu.codeBase + cpu.codeSize + cpu.stackSize)) || (dst != &cpu.registers[inst.dstReg] && (dst < cpu.codeBase || dst > cpu.codeBase + cpu.codeSize + cpu.stackSize))) {
		// Source or destination is out side of VM memory
		errorFlag = MEMORY_ACCESS;
		return false;
	}

	#define MATHOP(INST, OP, SIZE, DSTSIZE) \
    case INST: {         \
		*reinterpret_cast<DSTSIZE*>(dst) OP *reinterpret_cast<SIZE*>(src); \
		break; \
    }

	//USIZE is unsigned and SIZE is signed type => e.g. uint8_t and int8_t 
	#define BRANCH(USIZE, SIZE, DSTSIZE) \
	switch(inst.opcode) { \
		MATHOP(Opcodes::Add, +=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Mov, =, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Sub, -=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Xor, ^=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::And, &=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Or, |=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Sar, >>=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Sal, <<=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Div, /=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Mul, *=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Mod, %=, USIZE, DSTSIZE) \
	case Opcodes::Printi: \
		std::printf("%" PRIu64 "", *reinterpret_cast<USIZE*>(src)); \
		break; \
	case Opcodes::Prints: \
		std::printf("%s", src); \
		break; \
	case Opcodes::Printc: \
		std::printf("%c", *reinterpret_cast<USIZE*>(src)); \
		break; \
	case Opcodes::Inc: \
		*reinterpret_cast<USIZE*>(src) += 1; \
		break; \
	case Opcodes::Dec: \
		*reinterpret_cast<USIZE*>(src) -= 1; \
		break; \
	case Opcodes::Push: \
		push(*reinterpret_cast<USIZE*>(src)); \
		break; \
	case Opcodes::Pop: \
		*reinterpret_cast<USIZE*>(dst) = pop<USIZE>(); \
		break; \
	case Opcodes::Jz: \
		if (cpu.registers[flags] & ZERO_FLAG) { \
			cpu.registers[ip] += *reinterpret_cast<SIZE*>(src); \
			return true; \
		} \
		break; \
	case Opcodes::Jnz: \
		if (!(cpu.registers[flags] & ZERO_FLAG)) { \
			cpu.registers[ip] += *reinterpret_cast<SIZE*>(src); \
			return true; \
		} \
		break; \
	case Opcodes::Jg: \
		if (cpu.registers[flags] & GREATER_FLAG) { \
			cpu.registers[ip] += *reinterpret_cast<SIZE*>(src); \
			return true; \
		} \
		break; \
	case Opcodes::Js: \
		if (cpu.registers[flags] & SMALLER_FLAG) { \
			cpu.registers[ip] += *reinterpret_cast<SIZE*>(src); \
			return true; \
		} \
		break; \
	case Opcodes::Jmp: \
		cpu.registers[ip] += *reinterpret_cast<SIZE*>(src); \
		return true; \
	case Opcodes::Call: \
		push(cpu.registers[ip] + inst.instructionSize); \
		cpu.registers[ip] += *reinterpret_cast<SIZE*>(src); \
		return true; \
	case Opcodes::Ret: \
		cpu.registers[ip] = pop<uint64_t>(); \
		return true; \
	case Opcodes::Cmp: \
		if (*reinterpret_cast<USIZE*>(dst) == *reinterpret_cast<USIZE*>(src)) \
			cpu.registers[flags] = ZERO_FLAG; \
		else if (*reinterpret_cast<USIZE*>(dst) > *reinterpret_cast<USIZE*>(src)) \
			cpu.registers[flags] = GREATER_FLAG; \
		else \
			cpu.registers[flags] = SMALLER_FLAG; \
		break; \
	default: \
		return false; \
	}


	switch (inst.srcSize) {	
	case Size::Byte: 
		if (isDstReg) {
			BRANCH(uint8_t, int8_t, uint64_t);
		}
		else {
			BRANCH(uint8_t, int8_t, uint8_t);
		}
		break; 
	case Size::Short: 
		if (isDstReg) {
			BRANCH(uint16_t, int16_t, uint64_t);
		}
		else {
			BRANCH(uint16_t, int16_t, uint16_t);
		}
		break;
	case Size::Dword: 
		if (isDstReg) {
			BRANCH(uint32_t, int32_t, uint64_t);
		}
		else {
			BRANCH(uint32_t, int32_t, uint32_t);
		}
		break;
	default:
		BRANCH(uint64_t, int64_t, uint64_t);
		break;
	} 
	cpu.registers[ip] += inst.instructionSize;
	return true;
}